

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelExecutionTests.cpp
# Opt level: O3

void __thiscall
agge::tests::ParallelExecutionTests::MultithreadedParallelObjectMakesCallInDifferentThreads
          (ParallelExecutionTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  ulong uVar3;
  thread_id tVar4;
  void *pvVar5;
  FailedAssertion *pFVar6;
  long lVar7;
  char *__end;
  bool bVar8;
  log_container log;
  parallel p7;
  parallel p3;
  thread_capture tc;
  mutex mtx;
  string local_178;
  void *local_158;
  void *pvStack_150;
  undefined8 local_148;
  LocationInfo local_138;
  string local_110;
  parallel local_f0;
  parallel local_d0;
  kernel_function local_b0;
  void **local_a8;
  mutex *local_a0;
  mutex local_94;
  
  parallel::parallel(&local_d0,3);
  parallel::parallel(&local_f0,7);
  local_158 = (void *)0x0;
  pvStack_150 = (void *)0x0;
  local_148 = 0;
  mutex::mutex(&local_94);
  local_b0._vptr_kernel_function = (_func_int **)&PTR_operator___001c2c80;
  local_a8 = &local_158;
  local_a0 = &local_94;
  parallel::call(&local_d0,&local_b0);
  pvVar2 = pvStack_150;
  pvVar5 = local_158;
  if (local_158 != pvStack_150) {
    uVar3 = (long)pvStack_150 - (long)local_158 >> 4;
    lVar7 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_158,pvStack_150,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar5,pvVar2);
    pvVar5 = pvStack_150;
  }
  pvVar2 = local_158;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_178,0x67);
  paVar1 = &local_138.filename.field_2;
  if ((long)pvVar5 - (long)pvVar2 != 0x30) {
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  tVar4 = this_thread_id();
  pvVar5 = local_158;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_178,0x68);
  if (tVar4 != *(thread_id *)((long)pvVar5 + 8)) {
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if (pvStack_150 != local_158) {
    uVar3 = 0;
    do {
      pvVar5 = local_158;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_138,&local_178,0x6b);
      if ((int)uVar3 != *(int *)((long)pvVar5 + uVar3 * 0x10)) {
        pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Values are not equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
        __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
        operator_delete(local_138.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_158 == pvStack_150) {
        bVar8 = false;
      }
      else {
        lVar7 = 0;
        pvVar5 = local_158;
        do {
          lVar7 = lVar7 + (ulong)(*(long *)((long)pvVar5 + 8) ==
                                 *(long *)((long)local_158 + uVar3 * 0x10 + 8));
          pvVar5 = (void *)((long)pvVar5 + 0x10);
        } while (pvVar5 != pvStack_150);
        bVar8 = lVar7 == 1;
      }
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_138,&local_178,0x6c);
      if (!bVar8) {
        pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Values are not equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
        __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
        operator_delete(local_138.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < (ulong)((long)pvStack_150 - (long)local_158 >> 4));
  }
  if (pvStack_150 != local_158) {
    pvStack_150 = local_158;
  }
  parallel::call(&local_f0,&local_b0);
  pvVar2 = pvStack_150;
  pvVar5 = local_158;
  paVar1 = &local_138.filename.field_2;
  if (local_158 != pvStack_150) {
    uVar3 = (long)pvStack_150 - (long)local_158 >> 4;
    lVar7 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_158,pvStack_150,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,unsigned_long>*,std::vector<std::pair<unsigned_int,unsigned_long>,std::allocator<std::pair<unsigned_int,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar5,pvVar2);
    pvVar5 = pvStack_150;
  }
  pvVar2 = local_158;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_178,0x78);
  if ((long)pvVar5 - (long)pvVar2 != 0x70) {
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  tVar4 = this_thread_id();
  pvVar5 = local_158;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_178,0x79);
  if (tVar4 != *(thread_id *)((long)pvVar5 + 8)) {
    pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
    __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if (pvStack_150 != local_158) {
    uVar3 = 0;
    do {
      pvVar5 = local_158;
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_138,&local_178,0x7c);
      if ((int)uVar3 != *(int *)((long)pvVar5 + uVar3 * 0x10)) {
        pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Values are not equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
        __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
        operator_delete(local_138.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_158 == pvStack_150) {
        bVar8 = false;
      }
      else {
        lVar7 = 0;
        pvVar5 = local_158;
        do {
          lVar7 = lVar7 + (ulong)(*(long *)((long)pvVar5 + 8) ==
                                 *(long *)((long)local_158 + uVar3 * 0x10 + 8));
          pvVar5 = (void *)((long)pvVar5 + 0x10);
        } while (pvVar5 != pvStack_150);
        bVar8 = lVar7 == 1;
      }
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/ParallelExecutionTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_138,&local_178,0x7d);
      if (!bVar8) {
        pFVar6 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Values are not equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar6,&local_110,&local_138);
        __cxa_throw(pFVar6,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
        operator_delete(local_138.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (uVar3 < (ulong)((long)pvStack_150 - (long)local_158 >> 4));
  }
  mutex::~mutex(&local_94);
  if (local_158 != (void *)0x0) {
    operator_delete(local_158);
  }
  parallel::~parallel(&local_f0);
  parallel::~parallel(&local_d0);
  return;
}

Assistant:

test( MultithreadedParallelObjectMakesCallInDifferentThreads )
			{
				// INIT
				parallel p3(3), p7(7);
				thread_capture::log_container log;
				mutex mtx;
				thread_capture tc(log, mtx);

				// ACT
				p3.call(tc);

				// ASSERT
				sort(log.begin(), log.end());

				assert_equal(3u, log.size());
				assert_equal(this_thread_id(), log[0].second);
				for (count_t i = 0; i < log.size(); ++i)
				{
					assert_equal(i, log[i].first);
					assert_equal(1, count_if(log.begin(), log.end(), second_equal(log[i].second)));
				}

				// INIT
				log.clear();

				// ACT
				p7.call(tc);

				// ASSERT
				sort(log.begin(), log.end());

				assert_equal(7u, log.size());
				assert_equal(this_thread_id(), log[0].second);
				for (count_t i = 0; i < log.size(); ++i)
				{
					assert_equal(i, log[i].first);
					assert_equal(1, count_if(log.begin(), log.end(), second_equal(log[i].second)));
				}
			}